

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O2

void copytypeinfo(rnntypeinfo *dst,rnntypeinfo *src,char *file)

{
  int iVar1;
  uint64_t uVar2;
  rnnvalue **pprVar3;
  rnnvalue *prVar4;
  rnnbitfield **pprVar5;
  rnnbitfield *prVar6;
  int iVar7;
  long lVar8;
  
  dst->name = src->name;
  dst->shr = src->shr;
  uVar2 = src->max;
  dst->min = src->min;
  dst->max = uVar2;
  dst->align = src->align;
  for (lVar8 = 0; lVar8 < src->valsnum; lVar8 = lVar8 + 1) {
    iVar1 = dst->valsmax;
    if (iVar1 <= dst->valsnum) {
      iVar7 = iVar1 * 2;
      if (iVar1 == 0) {
        iVar7 = 0x10;
      }
      dst->valsmax = iVar7;
      pprVar3 = (rnnvalue **)realloc(dst->vals,(long)iVar7 << 3);
      dst->vals = pprVar3;
    }
    prVar4 = copyvalue(src->vals[lVar8],file);
    iVar1 = dst->valsnum;
    dst->valsnum = iVar1 + 1;
    dst->vals[iVar1] = prVar4;
  }
  for (lVar8 = 0; lVar8 < src->bitfieldsnum; lVar8 = lVar8 + 1) {
    iVar1 = dst->bitfieldsmax;
    if (iVar1 <= dst->bitfieldsnum) {
      iVar7 = iVar1 * 2;
      if (iVar1 == 0) {
        iVar7 = 0x10;
      }
      dst->bitfieldsmax = iVar7;
      pprVar5 = (rnnbitfield **)realloc(dst->bitfields,(long)iVar7 << 3);
      dst->bitfields = pprVar5;
    }
    prVar6 = copybitfield(src->bitfields[lVar8],file);
    iVar1 = dst->bitfieldsnum;
    dst->bitfieldsnum = iVar1 + 1;
    dst->bitfields[iVar1] = prVar6;
  }
  return;
}

Assistant:

static void copytypeinfo (struct rnntypeinfo *dst, struct rnntypeinfo *src, char *file) {
	int i;
	dst->name = src->name;
	dst->shr = src->shr;
	dst->min = src->min;
	dst->max = src->max;
	dst->align = src->align;
	for (i = 0; i < src->valsnum; i++)
		ADDARRAY(dst->vals, copyvalue(src->vals[i], file));
	for (i = 0; i < src->bitfieldsnum; i++)
		ADDARRAY(dst->bitfields, copybitfield(src->bitfields[i], file));
}